

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

pointVector * __thiscall Image::getBoundaries(pointVector *__return_storage_ptr__,Image *this)

{
  int iVar1;
  int iVar2;
  int in_R8D;
  long lVar3;
  long lVar4;
  Image edges;
  _InputArray local_f8;
  undefined1 local_e0 [96];
  undefined1 local_80 [16];
  undefined8 local_70;
  
  sobel((Image *)local_80,this);
  getBinaryMatrix((intMatrix *)&local_f8,(Image *)local_80);
  Image((Image *)local_e0,(intMatrix *)&local_f8);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_f8);
  cv::Mat::~Mat((Mat *)local_80);
  local_70 = 0;
  local_80._0_4_ = 0x1010000;
  local_f8.sz.width = 0;
  local_f8.sz.height = 0;
  local_f8.flags = 0x2010000;
  local_f8.obj = (Image *)local_e0;
  local_80._8_8_ = (Image *)local_e0;
  cv::cvtColor((cv *)local_80,&local_f8,(_OutputArray *)0x6,0,in_R8D);
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < (int)local_e0._8_4_) {
    lVar4 = 0;
    iVar2 = local_e0._8_4_;
    iVar1 = local_e0._12_4_;
    do {
      if (0 < iVar1) {
        lVar3 = 0;
        do {
          if (*(char *)(lVar3 + *(long *)local_e0._72_8_ * lVar4 + local_e0._16_8_) == -1) {
            local_80._0_4_ = (undefined4)lVar3;
            local_80._4_4_ = (undefined4)lVar4;
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            emplace_back<cv::Point_<int>>
                      ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)
                       __return_storage_ptr__,(Point_<int> *)local_80);
            iVar1 = local_e0._12_4_;
          }
          lVar3 = lVar3 + 1;
          iVar2 = local_e0._8_4_;
        } while (lVar3 < iVar1);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar2);
  }
  cv::Mat::~Mat((Mat *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

pointVector Image::getBoundaries() {
    Image edges(this->sobel().getBinaryMatrix());
    // Fix using the binary matrix
    cv::cvtColor(edges.content, edges.content, cv::COLOR_BGR2GRAY);
    pointVector boundaries;
    for(int i = 0; i<edges.content.rows;++i){
        for(int j=0; j<edges.content.cols;++j){
            if(edges.content.at<uchar>(i,j)==ON)
                boundaries.push_back(cv::Point(j,i));
        }
    }
    return boundaries;
}